

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-sp3.c
# Opt level: O0

void ingest_info_init(ingest_info_conflict *info)

{
  ingest_info_conflict *info_local;
  
  info->f = (FILE *)0x0;
  info->header = (coda_mem_record *)0x0;
  info->records = (coda_mem_array *)0x0;
  info->record = (coda_mem_record *)0x0;
  info->pos_clk_array = (coda_mem_array *)0x0;
  info->pos_clk = (coda_mem_record *)0x0;
  info->vel_rate_array = (coda_mem_array *)0x0;
  info->vel_rate = (coda_mem_record *)0x0;
  info->corr = (coda_mem_record *)0x0;
  info->num_satellites = 0;
  info->linenumber = 0;
  info->offset = 0;
  return;
}

Assistant:

static void ingest_info_init(ingest_info *info)
{
    info->f = NULL;
    info->header = NULL;
    info->records = NULL;
    info->record = NULL;
    info->pos_clk_array = NULL;
    info->pos_clk = NULL;
    info->vel_rate_array = NULL;
    info->vel_rate = NULL;
    info->corr = NULL;
    info->num_satellites = 0;
    info->linenumber = 0;
    info->offset = 0;
}